

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x11_window.c
# Opt level: O0

void disableCursor(_GLFWwindow *window)

{
  _GLFWwindow *in_RDI;
  _GLFWwindow *in_stack_00000010;
  double *in_stack_00000038;
  double *in_stack_00000040;
  _GLFWwindow *in_stack_00000048;
  
  if (in_RDI->rawMouseMotion != 0) {
    enableRawMouseMotion(in_stack_00000010);
  }
  _glfw.x11.disabledCursorWindow = in_RDI;
  _glfwGetCursorPosX11(in_stack_00000048,in_stack_00000040,in_stack_00000038);
  updateCursorImage((_GLFWwindow *)0xc1250e);
  _glfwCenterCursorInContentArea(window);
  captureCursor(in_stack_00000010);
  return;
}

Assistant:

static void disableCursor(_GLFWwindow* window)
{
    if (window->rawMouseMotion)
        enableRawMouseMotion(window);

    _glfw.x11.disabledCursorWindow = window;
    _glfwGetCursorPosX11(window,
                         &_glfw.x11.restoreCursorPosX,
                         &_glfw.x11.restoreCursorPosY);
    updateCursorImage(window);
    _glfwCenterCursorInContentArea(window);
    captureCursor(window);
}